

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.cpp
# Opt level: O0

AggregateFunction * duckdb::VarSampFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_stack_000000bf;
  LogicalType *in_stack_000000c0;
  LogicalType *in_stack_000000c8;
  LogicalType local_38 [24];
  LogicalType local_20 [32];
  
  duckdb::LogicalType::LogicalType(local_20,DOUBLE);
  duckdb::LogicalType::LogicalType(local_38,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::StddevState,double,double,duckdb::VarSampOperation,(duckdb::AggregateDestructorType)0>
            (in_stack_000000c8,in_stack_000000c0,in_stack_000000bf);
  duckdb::LogicalType::~LogicalType(local_38);
  duckdb::LogicalType::~LogicalType(local_20);
  return in_RDI;
}

Assistant:

AggregateFunction VarSampFun::GetFunction() {
	return AggregateFunction::UnaryAggregate<StddevState, double, double, VarSampOperation>(LogicalType::DOUBLE,
	                                                                                        LogicalType::DOUBLE);
}